

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__jpeg_decode_block
              (stbi__jpeg *j,short *data,stbi__huffman *hdc,stbi__huffman *hac,stbi__int16 *fac,
              int b,stbi__uint16 *dequant)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  short sVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  long *in_FS_OFFSET;
  
  if ((j->code_bits < 0x10) && (stbi__grow_buffer_unsafe(j), j->code_bits < 0x10)) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar14 = j->code_buffer;
  uVar7 = (ulong)hdc->fast[uVar14 >> 0x17];
  if (uVar7 == 0xff) {
    lVar12 = 0;
    do {
      lVar13 = lVar12;
      lVar12 = lVar13 + 1;
    } while (hdc->maxcode[lVar13 + 10] <= uVar14 >> 0x10);
    iVar5 = j->code_bits;
    if (lVar12 == 8) {
LAB_001be90c:
      j->code_bits = iVar5 + -0x10;
      goto LAB_001be969;
    }
    if (iVar5 < (int)(lVar13 + 10)) goto LAB_001be969;
    uVar3 = stbi__bmask[lVar13 + 10];
    iVar8 = hdc->delta[lVar13 + 10];
    j->code_bits = (iVar5 - (int)lVar12) + -9;
    j->code_buffer = uVar14 << ((byte)(lVar13 + 10) & 0x1f);
    uVar7 = (ulong)(int)((uVar14 >> (0x17U - (char)lVar12 & 0x1f) & uVar3) + iVar8);
  }
  else {
    bVar1 = hdc->size[uVar7];
    if (j->code_bits < (int)(uint)bVar1) goto LAB_001be969;
    j->code_buffer = uVar14 << (bVar1 & 0x1f);
    j->code_bits = j->code_bits - (uint)bVar1;
  }
  bVar1 = hdc->values[uVar7];
  if (bVar1 < 0x10) {
    data[0x38] = 0;
    data[0x39] = 0;
    data[0x3a] = 0;
    data[0x3b] = 0;
    data[0x3c] = 0;
    data[0x3d] = 0;
    data[0x3e] = 0;
    data[0x3f] = 0;
    data[0x30] = 0;
    data[0x31] = 0;
    data[0x32] = 0;
    data[0x33] = 0;
    data[0x34] = 0;
    data[0x35] = 0;
    data[0x36] = 0;
    data[0x37] = 0;
    data[0x28] = 0;
    data[0x29] = 0;
    data[0x2a] = 0;
    data[0x2b] = 0;
    data[0x2c] = 0;
    data[0x2d] = 0;
    data[0x2e] = 0;
    data[0x2f] = 0;
    data[0x20] = 0;
    data[0x21] = 0;
    data[0x22] = 0;
    data[0x23] = 0;
    data[0x24] = 0;
    data[0x25] = 0;
    data[0x26] = 0;
    data[0x27] = 0;
    data[0x18] = 0;
    data[0x19] = 0;
    data[0x1a] = 0;
    data[0x1b] = 0;
    data[0x1c] = 0;
    data[0x1d] = 0;
    data[0x1e] = 0;
    data[0x1f] = 0;
    data[0x10] = 0;
    data[0x11] = 0;
    data[0x12] = 0;
    data[0x13] = 0;
    data[0x14] = 0;
    data[0x15] = 0;
    data[0x16] = 0;
    data[0x17] = 0;
    data[8] = 0;
    data[9] = 0;
    data[10] = 0;
    data[0xb] = 0;
    data[0xc] = 0;
    data[0xd] = 0;
    data[0xe] = 0;
    data[0xf] = 0;
    data[0] = 0;
    data[1] = 0;
    data[2] = 0;
    data[3] = 0;
    data[4] = 0;
    data[5] = 0;
    data[6] = 0;
    data[7] = 0;
    if (bVar1 == 0) {
      iVar5 = 0;
    }
    else {
      iVar5 = j->code_bits;
      if (iVar5 < (int)(uint)bVar1) {
        stbi__grow_buffer_unsafe(j);
        iVar5 = j->code_bits;
      }
      uVar14 = j->code_buffer;
      uVar11 = uVar14 << (bVar1 & 0x1f) | uVar14 >> 0x20 - (bVar1 & 0x1f);
      uVar3 = *(uint *)((long)stbi__bmask + (ulong)((uint)bVar1 * 4));
      j->code_buffer = ~uVar3 & uVar11;
      j->code_bits = iVar5 - (uint)bVar1;
      iVar5 = 0;
      if (-1 < (int)uVar14) {
        iVar5 = *(int *)((long)stbi__jbias + (ulong)((uint)bVar1 * 4));
      }
      iVar5 = iVar5 + (uVar3 & uVar11);
    }
    iVar5 = iVar5 + j->img_comp[b].dc_pred;
    j->img_comp[b].dc_pred = iVar5;
    *data = (short)iVar5 * *dequant;
    iVar8 = 1;
    do {
      if (j->code_bits < 0x10) {
        stbi__grow_buffer_unsafe(j);
      }
      uVar14 = j->code_buffer;
      uVar7 = (ulong)(uVar14 >> 0x17);
      uVar2 = fac[uVar7];
      if (uVar2 == 0) {
        if (j->code_bits < 0x10) {
          stbi__grow_buffer_unsafe(j);
          uVar14 = j->code_buffer;
          uVar7 = (ulong)(uVar14 >> 0x17);
        }
        uVar7 = (ulong)hac->fast[uVar7];
        if (uVar7 == 0xff) {
          lVar12 = 0;
          do {
            lVar13 = lVar12;
            lVar12 = lVar13 + 1;
          } while (hac->maxcode[lVar13 + 10] <= uVar14 >> 0x10);
          iVar5 = j->code_bits;
          if (lVar12 == 8) goto LAB_001be90c;
          if (iVar5 < (int)(lVar13 + 10)) break;
          uVar3 = stbi__bmask[lVar13 + 10];
          iVar4 = hac->delta[lVar13 + 10];
          uVar11 = uVar14 << ((byte)(lVar13 + 10) & 0x1f);
          iVar10 = (iVar5 - (int)lVar12) + -9;
          j->code_bits = (iVar5 - (int)lVar12) + -9;
          j->code_buffer = uVar11;
          uVar7 = (ulong)(int)((uVar14 >> (0x17U - (char)lVar12 & 0x1f) & uVar3) + iVar4);
        }
        else {
          bVar1 = hac->size[uVar7];
          iVar10 = j->code_bits - (uint)bVar1;
          if (j->code_bits < (int)(uint)bVar1) break;
          uVar11 = uVar14 << (bVar1 & 0x1f);
          j->code_buffer = uVar11;
          j->code_bits = iVar10;
        }
        bVar1 = hac->values[uVar7];
        uVar14 = bVar1 & 0xf;
        if ((bVar1 & 0xf) == 0) {
          if (bVar1 != 0xf0) {
            return 1;
          }
          iVar8 = iVar8 + 0x10;
        }
        else {
          lVar12 = (long)iVar8 + (ulong)(bVar1 >> 4);
          bVar1 = ""[lVar12];
          if (iVar10 < (int)uVar14) {
            stbi__grow_buffer_unsafe(j);
            uVar11 = j->code_buffer;
            iVar10 = j->code_bits;
          }
          uVar6 = uVar11 << (sbyte)uVar14 | uVar11 >> 0x20 - (sbyte)uVar14;
          uVar3 = *(uint *)((long)stbi__bmask + (ulong)(uVar14 << 2));
          j->code_buffer = ~uVar3 & uVar6;
          j->code_bits = iVar10 - uVar14;
          sVar9 = 0;
          if (-1 < (int)uVar11) {
            sVar9 = (short)*(undefined4 *)((long)stbi__jbias + (ulong)(uVar14 << 2));
          }
          iVar8 = (int)lVar12 + 1;
          *(ushort *)((long)data + (ulong)((uint)bVar1 * 2)) =
               (((ushort)uVar6 & (ushort)uVar3) + sVar9) *
               *(short *)((long)dequant + (ulong)((uint)bVar1 * 2));
        }
      }
      else {
        j->code_buffer = uVar14 << (sbyte)(uVar2 & 0xf);
        j->code_bits = j->code_bits - (uVar2 & 0xf);
        lVar12 = (long)iVar8 + (ulong)(uVar2 >> 4 & 0xf);
        iVar8 = (int)lVar12 + 1;
        *(short *)((long)data + (ulong)((uint)""[lVar12] * 2)) =
             (short)(char)(uVar2 >> 8) * *(short *)((long)dequant + (ulong)((uint)""[lVar12] * 2));
      }
      if (0x3f < iVar8) {
        return 1;
      }
    } while( true );
  }
LAB_001be969:
  *(char **)(*in_FS_OFFSET + -0x20) = "bad huffman code";
  return 0;
}

Assistant:

static int stbi__jpeg_decode_block(stbi__jpeg *j, short data[64], stbi__huffman *hdc, stbi__huffman *hac, stbi__int16 *fac, int b, stbi__uint16 *dequant)
{
   int diff,dc,k;
   int t;

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
   t = stbi__jpeg_huff_decode(j, hdc);
   if (t < 0 || t > 15) return stbi__err("bad huffman code","Corrupt JPEG");

   // 0 all the ac values now so we can do it 32-bits at a time
   memset(data,0,64*sizeof(data[0]));

   diff = t ? stbi__extend_receive(j, t) : 0;
   dc = j->img_comp[b].dc_pred + diff;
   j->img_comp[b].dc_pred = dc;
   data[0] = (short) (dc * dequant[0]);

   // decode AC components, see JPEG spec
   k = 1;
   do {
      unsigned int zig;
      int c,r,s;
      if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
      c = (j->code_buffer >> (32 - FAST_BITS)) & ((1 << FAST_BITS)-1);
      r = fac[c];
      if (r) { // fast-AC path
         k += (r >> 4) & 15; // run
         s = r & 15; // combined length
         j->code_buffer <<= s;
         j->code_bits -= s;
         // decode into unzigzag'd location
         zig = stbi__jpeg_dezigzag[k++];
         data[zig] = (short) ((r >> 8) * dequant[zig]);
      } else {
         int rs = stbi__jpeg_huff_decode(j, hac);
         if (rs < 0) return stbi__err("bad huffman code","Corrupt JPEG");
         s = rs & 15;
         r = rs >> 4;
         if (s == 0) {
            if (rs != 0xf0) break; // end block
            k += 16;
         } else {
            k += r;
            // decode into unzigzag'd location
            zig = stbi__jpeg_dezigzag[k++];
            data[zig] = (short) (stbi__extend_receive(j,s) * dequant[zig]);
         }
      }
   } while (k < 64);
   return 1;
}